

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

void cmd_set_arg(command_conflict *cmd,char *name,cmd_arg_type type,cmd_arg_data_conflict data)

{
  cmd_arg *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  char *__s1;
  
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x21a,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  if (*name == '\0') {
    __assert_fail("name[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x21b,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  __s1 = cmd->arg[0].name;
  iVar3 = -1;
  lVar4 = 0;
  iVar5 = -1;
  do {
    if (lVar4 == 4) goto LAB_0012d981;
    iVar2 = (int)lVar4;
    if (iVar5 != -1) {
      iVar2 = iVar5;
    }
    if (*__s1 == '\0') {
      iVar5 = iVar2;
    }
    iVar2 = strcmp(__s1,name);
    lVar4 = lVar4 + 1;
    __s1 = __s1 + 0x28;
  } while (iVar2 != 0);
  iVar3 = (int)lVar4 + -1;
LAB_0012d981:
  if ((iVar5 == -1) && (iVar3 == -1)) {
    __assert_fail("first_empty != -1 || idx != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x229,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  if (iVar3 != -1) {
    iVar5 = iVar3;
  }
  pcVar1 = cmd->arg + iVar5;
  pcVar1->type = type;
  pcVar1->data = data;
  my_strcpy(pcVar1->name,name,0x14);
  return;
}

Assistant:

static void cmd_set_arg(struct command *cmd, const char *name,
						enum cmd_arg_type type, union cmd_arg_data data)
{
	size_t i;

	int first_empty = -1;
	int idx = -1;

	assert(name);
	assert(name[0]);

	/* Find an arg that either... */
	for (i = 0; i < CMD_MAX_ARGS; i++) {
		struct cmd_arg *arg = &cmd->arg[i];
		if (!arg->name[0] && first_empty == -1)
			first_empty = i;

		if (streq(arg->name, name)) {
			idx = i;
			break;
		}
	}

	assert(first_empty != -1 || idx != -1);

	if (idx == -1)
		idx = first_empty;

	cmd->arg[idx].type = type;
	cmd->arg[idx].data = data;
	my_strcpy(cmd->arg[idx].name, name, sizeof cmd->arg[0].name);
}